

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

char * __thiscall IR::Instr::GetBailOutKindName(Instr *this)

{
  BailOutKind kind;
  BailOutKind BVar1;
  char *pcVar2;
  
  kind = BailOutInvalid;
  if ((this->field_0x38 & 0x10) != 0) {
    kind = GetBailOutKind(this);
  }
  if ((this->field_0x38 & 0x40) != 0) {
    BVar1 = GetAuxBailOutKind(this);
    kind = kind | BVar1;
  }
  pcVar2 = ::GetBailOutKindName(kind);
  return pcVar2;
}

Assistant:

const char *
Instr::GetBailOutKindName() const
{
    IR::BailOutKind kind = (IR::BailOutKind)0;
    if (this->HasBailOutInfo())
    {
        kind |= this->GetBailOutKind();
    }
    if (this->HasAuxBailOut())
    {
        kind |= this->GetAuxBailOutKind();
    }

    return ::GetBailOutKindName(kind);
}